

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::TemplatedFetchCommitted<float>(UpdateInfo *info,Vector *result)

{
  uint uVar1;
  data_ptr_t __dest;
  UpdateInfo *pUVar2;
  ulong uVar3;
  
  __dest = result->data;
  uVar3 = (ulong)info->N;
  uVar1 = info->max;
  if (uVar3 == 0x800) {
    switchD_00b1422a::default(__dest,(void *)((long)&info[1].segment + (ulong)uVar1 * 4),0x2000);
    return;
  }
  if (uVar3 != 0) {
    pUVar2 = info + 1;
    do {
      *(undefined4 *)(__dest + (ulong)*(uint *)&pUVar2->segment * 4) =
           *(undefined4 *)((long)&pUVar2->segment + (ulong)uVar1 * 4);
      pUVar2 = (UpdateInfo *)((long)&pUVar2->segment + 4);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void TemplatedFetchCommitted(UpdateInfo &info, Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	MergeUpdateInfo<T>(info, result_data);
}